

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_cts.c
# Opt level: O0

size_t cts128_cs2_encrypt(PROV_CIPHER_CTX *ctx,uchar *in,uchar *out,size_t len)

{
  int iVar1;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  size_t in_RDI;
  uchar *in_stack_fffffffffffffff8;
  
  if ((in_RCX & 0xf) == 0) {
    iVar1 = (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,in_RDX,in_RSI,in_RCX);
    if (iVar1 == 0) {
      in_RCX = 0;
    }
  }
  else {
    in_RCX = cts128_cs3_encrypt((PROV_CIPHER_CTX *)out,(uchar *)len,in_stack_fffffffffffffff8,in_RDI
                               );
  }
  return in_RCX;
}

Assistant:

static size_t cts128_cs2_encrypt(PROV_CIPHER_CTX *ctx, const unsigned char *in,
                                 unsigned char *out, size_t len)
{
    if (len % CTS_BLOCK_SIZE == 0) {
        /* If there are no partial blocks then it is the same as CBC mode */
        if (!ctx->hw->cipher(ctx, out, in, len))
            return 0;
        return len;
    }
    /* For partial blocks CS2 is equivalent to CS3 */
    return cts128_cs3_encrypt(ctx, in, out, len);
}